

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmc_blocking_q.h
# Opt level: O1

void __thiscall
spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::enqueue
          (mpmc_blocking_queue<spdlog::details::async_msg> *this,async_msg *item)

{
  unique_lock<std::mutex> lock;
  unique_lock<std::mutex> local_28;
  
  local_28._M_owns = false;
  local_28._M_device = &this->queue_mutex_;
  std::unique_lock<std::mutex>::lock(&local_28);
  local_28._M_owns = true;
  std::condition_variable::
  wait<spdlog::details::mpmc_blocking_queue<spdlog::details::async_msg>::enqueue(spdlog::details::async_msg&&)::_lambda()_1_>
            (&this->pop_cv_,&local_28,(anon_class_8_1_8991fb9c)this);
  circular_q<spdlog::details::async_msg>::push_back(&this->q_,item);
  std::unique_lock<std::mutex>::~unique_lock(&local_28);
  std::condition_variable::notify_one();
  return;
}

Assistant:

void enqueue(T &&item) {
        {
            std::unique_lock<std::mutex> lock(queue_mutex_);
            pop_cv_.wait(lock, [this] { return !this->q_.full(); });
            q_.push_back(std::move(item));
        }
        push_cv_.notify_one();
    }